

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycled.hpp
# Opt level: O0

void __thiscall
Lib::Recycled<Kernel::RobSubstitution,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::~Recycled
          (Recycled<Kernel::RobSubstitution,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *this)

{
  bool bVar1;
  Stack<std::unique_ptr<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_>_>
  *this_00;
  Stack<std::unique_ptr<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_>_>
  *elem;
  long in_RDI;
  RobSubstitution *in_stack_ffffffffffffffa8;
  DefaultKeepRecycled *in_stack_ffffffffffffffb0;
  DefaultKeepRecycled local_10 [16];
  
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_>
                      *)0x324ee8);
  if (bVar1) {
    self((Recycled<Kernel::RobSubstitution,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)0x324f07)
    ;
    bVar1 = DefaultKeepRecycled::operator()(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    if ((bVar1) &&
       ((Recycled<Kernel::RobSubstitution,Lib::DefaultReset,Lib::DefaultKeepRecycled>::memAlive & 1)
        != 0)) {
      this_00 = (Stack<std::unique_ptr<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_>_>
                 *)(in_RDI + 8);
      self((Recycled<Kernel::RobSubstitution,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)
           0x324f4c);
      DefaultReset::operator()((DefaultReset *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      elem = mem();
      in_stack_ffffffffffffffb0 = local_10;
      std::unique_ptr<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_>::
      unique_ptr((unique_ptr<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_>
                  *)in_stack_ffffffffffffffb0,
                 (unique_ptr<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_>
                  *)in_stack_ffffffffffffffa8);
      Stack<std::unique_ptr<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_>_>
      ::push(this_00,(unique_ptr<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_>
                      *)elem);
      std::unique_ptr<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_>::
      ~unique_ptr((unique_ptr<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_>
                   *)in_stack_ffffffffffffffb0);
    }
  }
  std::unique_ptr<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_>::
  ~unique_ptr((unique_ptr<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_> *)
              in_stack_ffffffffffffffb0);
  return;
}

Assistant:

~Recycled()
  {
    if (IF_USE_PTRS(_self, true) && _keep(self()) && memAlive) {
      _reset(self());
      mem().push(std::move(_self));
    }
  }